

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::axisMesh(Mesh *__return_storage_ptr__,float _size,float _y)

{
  vec3 local_270;
  vec3 local_264;
  Mesh local_258;
  vec3 local_1b0;
  vec3 local_1a4;
  Mesh local_198;
  vec3 local_f0;
  vec3 local_e4;
  Mesh local_d8;
  undefined1 local_19;
  float local_18;
  float local_14;
  float _y_local;
  float _size_local;
  Mesh *mesh;
  
  local_19 = 0;
  local_18 = _y;
  local_14 = _size;
  __y_local = __return_storage_ptr__;
  Mesh::Mesh(__return_storage_ptr__);
  Mesh::setDrawMode(__return_storage_ptr__,LINES);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,float,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_e4,local_14,local_18,0.0);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,float,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_f0,-local_14,local_18,0.0);
  lineMesh(&local_d8,&local_e4,&local_f0);
  Mesh::append(__return_storage_ptr__,&local_d8);
  Mesh::~Mesh(&local_d8);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,float,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_1a4,0.0,local_14,0.0);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,float,double>
            ((vec<3,float,(glm::qualifier)0> *)&local_1b0,0.0,-local_14,0.0);
  lineMesh(&local_198,&local_1a4,&local_1b0);
  Mesh::append(__return_storage_ptr__,&local_198);
  Mesh::~Mesh(&local_198);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,float,float>
            ((vec<3,float,(glm::qualifier)0> *)&local_264,0.0,local_18,local_14);
  glm::vec<3,float,(glm::qualifier)0>::vec<double,float,float>
            ((vec<3,float,(glm::qualifier)0> *)&local_270,0.0,local_18,-local_14);
  lineMesh(&local_258,&local_264,&local_270);
  Mesh::append(__return_storage_ptr__,&local_258);
  Mesh::~Mesh(&local_258);
  return __return_storage_ptr__;
}

Assistant:

Mesh axisMesh(float _size, float _y) {
    Mesh mesh;
    mesh.setDrawMode(LINES);

    mesh.append( lineMesh(glm::vec3(_size,_y,0.0), glm::vec3(-_size,_y,0.0)));
    mesh.append( lineMesh(glm::vec3(0.0, _size, 0.0), glm::vec3(0.0, -_size, 0.0)));
    mesh.append( lineMesh(glm::vec3(0.0, _y, _size), glm::vec3(0.0, _y, -_size)));

    return mesh;
}